

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvalidator.c
# Opt level: O0

bool_t ProfileCallback(void *opaque,int type,tchar_t *ClassName,ebml_element *Elt)

{
  undefined8 uVar1;
  uint uVar2;
  tchar_t *ptVar3;
  filepos_t fVar4;
  filepos_t fVar5;
  profile_check *check;
  ebml_element *Elt_local;
  tchar_t *ClassName_local;
  int type_local;
  void *opaque_local;
  
  if (type == 0) {
    ptVar3 = GetProfileName((long)*(int *)((long)opaque + 0x18));
    uVar1 = *(undefined8 *)((long)opaque + 0x10);
    fVar4 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
    uVar2 = OutputError(0x201,"Invalid \'%s\' for profile \'%s\' in %s at %ld",ClassName,ptVar3,
                        uVar1,fVar4);
    **opaque = uVar2 | **opaque;
  }
  else if (type == 1) {
    uVar1 = *(undefined8 *)((long)opaque + 0x10);
    fVar4 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
    uVar2 = OutputError(0x200,"Missing element \'%s\' in %s at %ld",ClassName,uVar1,fVar4);
    **opaque = uVar2 | **opaque;
  }
  else if (type == 2) {
    uVar1 = *(undefined8 *)((long)opaque + 0x10);
    fVar4 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
    fVar5 = EBML_ElementPosition(Elt);
    uVar2 = OutputError(0x202,"Unique element \'%s\' in %s at %ld found more than once at %ld",
                        ClassName,uVar1,fVar4,fVar5);
    **opaque = uVar2 | **opaque;
  }
  return 0;
}

Assistant:

static bool_t ProfileCallback(void *opaque, int type, const tchar_t *ClassName, const ebml_element* Elt)
{
    struct profile_check *check = opaque;
    if (type==MASTER_CHECK_PROFILE_INVALID)
        *check->Result |= OutputError(0x201,T("Invalid '%s' for profile '%s' in %s at %") TPRId64,ClassName,GetProfileName(check->ProfileMask),check->EltName,EL_Pos(check->Parent));
    else if (type==MASTER_CHECK_MISSING_MANDATORY)
        *check->Result |= OutputError(0x200,T("Missing element '%s' in %s at %") TPRId64, ClassName,check->EltName,EL_Pos(check->Parent));
    else if (type==MASTER_CHECK_MULTIPLE_UNIQUE)
        *check->Result |= OutputError(0x202,T("Unique element '%s' in %s at %") TPRId64 T(" found more than once at %") TPRId64, ClassName,check->EltName,EL_Pos(check->Parent),EL_Pos(Elt));
    return 0; // don't remove anything
}